

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

int __thiscall
ON_PolyCurve::SegmentIndex
          (ON_PolyCurve *this,ON_Interval sub_domain,int *segment_index0,int *segment_index1)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  ON_Interval OVar6;
  double local_70;
  double local_68;
  ON_Interval local_60;
  undefined1 local_50 [8];
  ON_Interval seg_dom;
  int local_38;
  int s1;
  int s0;
  int segment_count;
  int *segment_index1_local;
  int *segment_index0_local;
  ON_PolyCurve *this_local;
  ON_Interval sub_domain_local;
  
  dVar4 = sub_domain.m_t[1];
  this_local = sub_domain.m_t[0];
  sub_domain_local.m_t[0] = dVar4;
  iVar2 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
  local_38 = 0;
  seg_dom.m_t[1]._4_4_ = 0;
  ON_Interval::ON_Interval((ON_Interval *)local_50);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  local_60.m_t[1] = dVar4;
  ON_Interval::Intersection((ON_Interval *)&this_local,&local_60);
  bVar1 = ON_Interval::IsIncreasing((ON_Interval *)&this_local);
  if (bVar1) {
    dVar4 = ON_Interval::Min((ON_Interval *)&this_local);
    local_38 = SegmentIndex(this,dVar4);
    seg_dom.m_t[1]._4_4_ = local_38;
    do {
      seg_dom.m_t[1]._4_4_ = seg_dom.m_t[1]._4_4_ + 1;
      if (iVar2 <= seg_dom.m_t[1]._4_4_) break;
      OVar6 = SegmentDomain(this,seg_dom.m_t[1]._4_4_);
      local_70 = OVar6.m_t[0];
      local_50 = (undefined1  [8])local_70;
      local_68 = OVar6.m_t[1];
      seg_dom.m_t[0] = local_68;
      pdVar3 = ON_Interval::operator[]((ON_Interval *)local_50,0);
      dVar4 = *pdVar3;
      dVar5 = ON_Interval::Max((ON_Interval *)&this_local);
    } while (dVar4 < dVar5);
  }
  if (segment_index0 != (int *)0x0) {
    *segment_index0 = local_38;
  }
  if (segment_index1 != (int *)0x0) {
    *segment_index1 = seg_dom.m_t[1]._4_4_;
  }
  return seg_dom.m_t[1]._4_4_ - local_38;
}

Assistant:

int ON_PolyCurve::SegmentIndex(
  ON_Interval sub_domain,
  int* segment_index0,
  int* segment_index1
  ) const
{
  const int segment_count = m_segment.Count();
  int s0 = 0, s1 = 0;
  ON_Interval seg_dom;
  sub_domain.Intersection( Domain() );
  if ( sub_domain.IsIncreasing() )
  {
    s0 = SegmentIndex(sub_domain.Min());
    for ( s1 = s0+1; s1 < segment_count; s1++ )
    {
      seg_dom = SegmentDomain(s1);
      if ( seg_dom[0] >= sub_domain.Max() )
        break;
    }
  }
  if ( segment_index0 )
    *segment_index0 = s0;
  if ( segment_index1 )
    *segment_index1 = s1;
  return s1-s0;
}